

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O3

string * toml::format_error<>
                   (string *__return_storage_ptr__,string *title,source_location *loc,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_160;
  string local_140;
  string local_120;
  error_info local_100;
  source_location local_a8;
  
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  local_160._M_dataplus._M_p = (title->_M_dataplus)._M_p;
  paVar1 = &title->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p == paVar1) {
    local_160.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_160.field_2._8_8_ = *(undefined8 *)((long)&title->field_2 + 8);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_160._M_string_length = title->_M_string_length;
  (title->_M_dataplus)._M_p = (pointer)paVar1;
  title->_M_string_length = 0;
  (title->field_2)._M_local_buf[0] = '\0';
  local_a8.is_ok_ = loc->is_ok_;
  local_a8._1_7_ = *(undefined7 *)&loc->field_0x1;
  local_a8.first_line_ = loc->first_line_;
  local_a8.first_column_ = loc->first_column_;
  local_a8.first_offset_ = loc->first_offset_;
  local_a8.last_line_ = loc->last_line_;
  local_a8.last_column_ = loc->last_column_;
  local_a8.last_offset_ = loc->last_offset_;
  local_a8.length_ = loc->length_;
  local_a8.file_name_._M_dataplus._M_p = (pointer)&local_a8.file_name_.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(loc->file_name_)._M_dataplus._M_p;
  paVar1 = &(loc->file_name_).field_2;
  if (paVar2 == paVar1) {
    local_a8.file_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.file_name_.field_2._8_8_ = *(undefined8 *)((long)&(loc->file_name_).field_2 + 8);
  }
  else {
    local_a8.file_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.file_name_._M_dataplus._M_p = (pointer)paVar2;
  }
  local_a8.file_name_._M_string_length = (loc->file_name_)._M_string_length;
  (loc->file_name_)._M_dataplus._M_p = (pointer)paVar1;
  (loc->file_name_)._M_string_length = 0;
  (loc->file_name_).field_2._M_local_buf[0] = '\0';
  local_a8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (loc->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (loc->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (loc->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (loc->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (loc->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (loc->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140._M_dataplus._M_p = (msg->_M_dataplus)._M_p;
  paVar1 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p == paVar1) {
    local_140.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_140.field_2._8_8_ = *(undefined8 *)((long)&msg->field_2 + 8);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_140._M_string_length = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar1;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  make_error_info<>(&local_100,&local_160,&local_a8,&local_140);
  format_error(__return_storage_ptr__,&local_120,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.suffix_._M_dataplus._M_p != &local_100.suffix_.field_2) {
    operator_delete(local_100.suffix_._M_dataplus._M_p,
                    local_100.suffix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_100.locations_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.title_._M_dataplus._M_p != &local_100.title_.field_2) {
    operator_delete(local_100.title_._M_dataplus._M_p,
                    local_100.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_error(std::string title,
        source_location loc, std::string msg, Ts&& ... tail)
{
    return format_error("", make_error_info(std::move(title),
                std::move(loc), std::move(msg), std::forward<Ts>(tail)...));
}